

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

Vec3fa __thiscall embree::HeightField::at(HeightField *this,size_t x,size_t y)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  RefCount RVar4;
  ulong in_RCX;
  undefined4 extraout_XMM0_Db;
  float fVar5;
  float fVar6;
  Vec3fa VVar7;
  Color4 c;
  float local_48 [6];
  
  plVar1 = *(long **)(x + 0x10);
  lVar2 = plVar1[2];
  lVar3 = plVar1[3];
  (**(code **)(*plVar1 + 0x20))(local_48);
  VVar7.field_0._0_4_ =
       ((float)y / (float)(lVar2 - 1)) * (*(float *)(x + 0x30) - *(float *)(x + 0x20)) +
       *(float *)(x + 0x20);
  VVar7.field_0.m128[1] = (float)extraout_XMM0_Db;
  fVar5 = (float)*(undefined8 *)(x + 0x24);
  fVar6 = (float)((ulong)*(undefined8 *)(x + 0x24) >> 0x20);
  VVar7.field_0._8_4_ = ((float)*(undefined8 *)(x + 0x34) - fVar5) * local_48[0] + fVar5;
  VVar7.field_0._12_4_ =
       ((float)((ulong)*(undefined8 *)(x + 0x34) >> 0x20) - fVar6) *
       ((float)in_RCX / (float)(lVar3 - 1)) + fVar6;
  RVar4._vptr_RefCount._4_4_ = VVar7.field_0._8_4_;
  RVar4._vptr_RefCount._0_4_ = VVar7.field_0._0_4_;
  RVar4.refCounter.super___atomic_base<unsigned_long>._M_i._0_4_ = VVar7.field_0._12_4_;
  RVar4.refCounter.super___atomic_base<unsigned_long>._M_i._4_4_ = 0;
  this->super_RefCount = RVar4;
  return (Vec3fa)VVar7.field_0;
}

Assistant:

const Vec3fa at(const size_t x, const size_t y)
    {
      const size_t width  = texture->width;
      const size_t height = texture->height;
      const Color4 c = texture->get(x,y);
      const Vec2f p(x/float(width-1),y/float(height-1));
      const float px = p.x*(bounds.upper.x-bounds.lower.x) + bounds.lower.x;
      const float py = c.r*(bounds.upper.y-bounds.lower.y) + bounds.lower.y;
      const float pz = p.y*(bounds.upper.z-bounds.lower.z) + bounds.lower.z;
      return Vec3fa(px,py,pz);
    }